

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,char *s)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  allocator<char> local_71;
  string local_70 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_30;
  char *local_18;
  char *s_local;
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
            );
  __s = local_18;
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  _vptr_MatcherBase = (_func_int **)&PTR__Matcher_001a7248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,__s,&local_71);
  Eq<std::__cxx11::string>(&local_50,(testing *)local_70,x);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_30,(ComparisonBase *)&local_50);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher(&local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}